

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O3

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlyFinish
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btContactSolverInfo *infoGlobal)

{
  float *pfVar1;
  btScalar bVar2;
  
  if (((this->m_pNC).m_size < 0) && ((this->m_pNC).m_capacity < 0)) {
    pfVar1 = (this->m_pNC).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_pNC).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_pNC).m_ownsMemory = true;
    (this->m_pNC).m_data = (float *)0x0;
    (this->m_pNC).m_capacity = 0;
  }
  (this->m_pNC).m_size = 0;
  if (((this->m_pC).m_size < 0) && ((this->m_pC).m_capacity < 0)) {
    pfVar1 = (this->m_pC).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_pC).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_pC).m_ownsMemory = true;
    (this->m_pC).m_data = (float *)0x0;
    (this->m_pC).m_capacity = 0;
  }
  (this->m_pC).m_size = 0;
  if (((this->m_pCF).m_size < 0) && ((this->m_pCF).m_capacity < 0)) {
    pfVar1 = (this->m_pCF).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_pCF).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_pCF).m_ownsMemory = true;
    (this->m_pCF).m_data = (float *)0x0;
    (this->m_pCF).m_capacity = 0;
  }
  (this->m_pCF).m_size = 0;
  if (((this->m_pCRF).m_size < 0) && ((this->m_pCRF).m_capacity < 0)) {
    pfVar1 = (this->m_pCRF).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_pCRF).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_pCRF).m_ownsMemory = true;
    (this->m_pCRF).m_data = (float *)0x0;
    (this->m_pCRF).m_capacity = 0;
  }
  (this->m_pCRF).m_size = 0;
  if (((this->m_deltafNC).m_size < 0) && ((this->m_deltafNC).m_capacity < 0)) {
    pfVar1 = (this->m_deltafNC).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_deltafNC).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_deltafNC).m_ownsMemory = true;
    (this->m_deltafNC).m_data = (float *)0x0;
    (this->m_deltafNC).m_capacity = 0;
  }
  (this->m_deltafNC).m_size = 0;
  if (((this->m_deltafC).m_size < 0) && ((this->m_deltafC).m_capacity < 0)) {
    pfVar1 = (this->m_deltafC).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_deltafC).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_deltafC).m_ownsMemory = true;
    (this->m_deltafC).m_data = (float *)0x0;
    (this->m_deltafC).m_capacity = 0;
  }
  (this->m_deltafC).m_size = 0;
  if (((this->m_deltafCF).m_size < 0) && ((this->m_deltafCF).m_capacity < 0)) {
    pfVar1 = (this->m_deltafCF).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_deltafCF).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_deltafCF).m_ownsMemory = true;
    (this->m_deltafCF).m_data = (float *)0x0;
    (this->m_deltafCF).m_capacity = 0;
  }
  (this->m_deltafCF).m_size = 0;
  if (((this->m_deltafCRF).m_size < 0) && ((this->m_deltafCRF).m_capacity < 0)) {
    pfVar1 = (this->m_deltafCRF).m_data;
    if ((pfVar1 != (float *)0x0) && ((this->m_deltafCRF).m_ownsMemory == true)) {
      btAlignedFreeInternal(pfVar1);
    }
    (this->m_deltafCRF).m_ownsMemory = true;
    (this->m_deltafCRF).m_data = (float *)0x0;
    (this->m_deltafCRF).m_capacity = 0;
  }
  (this->m_deltafCRF).m_size = 0;
  bVar2 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyFinish
                    (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,infoGlobal);
  return bVar2;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlyFinish(btCollisionObject** bodies,int numBodies,const btContactSolverInfo& infoGlobal)
{
	m_pNC.resizeNoInitialize(0);
	m_pC.resizeNoInitialize(0);
	m_pCF.resizeNoInitialize(0);
	m_pCRF.resizeNoInitialize(0);

	m_deltafNC.resizeNoInitialize(0);
	m_deltafC.resizeNoInitialize(0);
	m_deltafCF.resizeNoInitialize(0);
	m_deltafCRF.resizeNoInitialize(0);

	return btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyFinish(bodies, numBodies, infoGlobal);
}